

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

string * randomfloats_abi_cxx11_(string *__return_storage_ptr__,uint64_t howmany)

{
  double dVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  stringstream out;
  stringstream local_1b8 [16];
  long local_1a8;
  undefined8 local_1a0 [13];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (howmany != 0) {
    uVar4 = 1;
    lVar6 = 0x4a6;
    lVar5 = 2;
    do {
      uVar3 = (lVar6 + uVar4 >> 0x21 ^ lVar6 + uVar4) * -0xae502812aa7333;
      uVar3 = (uVar3 >> 0x21 ^ uVar3) * -0x3b314601e57a13ad;
      dVar1 = (double)(uVar3 >> 0x21 ^ uVar3);
      while (0x7fefffffffffffff < (ulong)ABS(dVar1)) {
        uVar3 = lVar5 + lVar6;
        lVar6 = lVar6 + 1;
        uVar3 = (uVar3 >> 0x21 ^ uVar3) * -0xae502812aa7333;
        uVar3 = (uVar3 >> 0x21 ^ uVar3) * -0x3b314601e57a13ad;
        dVar1 = (double)(uVar3 >> 0x21 ^ uVar3);
      }
      *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 0xf;
      poVar2 = std::ostream::_M_insert<double>(dVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 1;
    } while (uVar4 <= howmany);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string randomfloats(uint64_t howmany) {
  std::stringstream out;
  uint64_t offset = 1190;
  for (size_t i = 1; i <= howmany; i++) {
    uint64_t x = rng(i + offset);
    double d;
    ::memcpy(&d, &x, sizeof(double));
    // paranoid
    while (!std::isfinite(d)) {
      offset++;
      x = rng(i + offset);
      ::memcpy(&d, &x, sizeof(double));
    }
    out << std::setprecision(DBL_DIG) << d << " ";
  }
  return out.str();
}